

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

void __thiscall
cmCursesMainForm::FixValue(cmCursesMainForm *this,CacheEntryType type,string *in,string *out)

{
  string_view val;
  bool bVar1;
  string local_48 [32];
  string *local_28;
  string *out_local;
  string *in_local;
  cmCursesMainForm *pcStack_10;
  CacheEntryType type_local;
  cmCursesMainForm *this_local;
  
  local_28 = out;
  out_local = in;
  in_local._4_4_ = type;
  pcStack_10 = this;
  std::__cxx11::string::find_last_not_of((char)in,0x20);
  std::__cxx11::string::substr((ulong)local_48,(ulong)in);
  std::__cxx11::string::operator=((string *)local_28,local_48);
  std::__cxx11::string::~string(local_48);
  if ((in_local._4_4_ == PATH) || (in_local._4_4_ == FILEPATH)) {
    cmsys::SystemTools::ConvertToUnixSlashes(local_28);
  }
  if (in_local._4_4_ == BOOL) {
    val = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_28);
    bVar1 = cmIsOff(val);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)local_28,"OFF");
    }
    else {
      std::__cxx11::string::operator=((string *)local_28,"ON");
    }
  }
  return;
}

Assistant:

void cmCursesMainForm::FixValue(cmStateEnums::CacheEntryType type,
                                const std::string& in, std::string& out) const
{
  out = in.substr(0, in.find_last_not_of(' ') + 1);
  if (type == cmStateEnums::PATH || type == cmStateEnums::FILEPATH) {
    cmSystemTools::ConvertToUnixSlashes(out);
  }
  if (type == cmStateEnums::BOOL) {
    if (cmIsOff(out)) {
      out = "OFF";
    } else {
      out = "ON";
    }
  }
}